

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3,int hasres)

{
  StkId pTVar1;
  StkId func_00;
  StkId pTVar2;
  undefined4 uVar3;
  Value *pVVar4;
  TValue *io1_4;
  TValue *io1_3;
  TValue *io1_2;
  TValue *io1_1;
  TValue *io1;
  StkId func;
  ptrdiff_t result;
  int hasres_local;
  TValue *p3_local;
  TValue *p2_local;
  TValue *p1_local;
  TValue *f_local;
  lua_State *L_local;
  
  pTVar1 = L->stack;
  func_00 = L->top;
  func_00->value_ = f->value_;
  uVar3 = *(undefined4 *)&f->field_0xc;
  func_00->tt_ = f->tt_;
  *(undefined4 *)&func_00->field_0xc = uVar3;
  func_00[1].value_ = p1->value_;
  uVar3 = *(undefined4 *)&p1->field_0xc;
  func_00[1].tt_ = p1->tt_;
  *(undefined4 *)&func_00[1].field_0xc = uVar3;
  func_00[2].value_ = p2->value_;
  uVar3 = *(undefined4 *)&p2->field_0xc;
  func_00[2].tt_ = p2->tt_;
  *(undefined4 *)&func_00[2].field_0xc = uVar3;
  L->top = L->top + 3;
  if (hasres == 0) {
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->value_ = p3->value_;
    uVar3 = *(undefined4 *)&p3->field_0xc;
    pTVar2->tt_ = p3->tt_;
    *(undefined4 *)&pTVar2->field_0xc = uVar3;
  }
  if ((L->ci->callstatus & 2) == 0) {
    luaD_callnoyield(L,func_00,hasres);
  }
  else {
    luaD_call(L,func_00,hasres);
  }
  if (hasres != 0) {
    pVVar4 = (Value *)((long)L->stack + ((long)p3 - (long)pTVar1));
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    *pVVar4 = pTVar1[-1].value_;
    pVVar4[1] = *(Value *)&pTVar1[-1].tt_;
  }
  return;
}

Assistant:

void luaT_callTM(lua_State *L, const TValue *f, const TValue *p1,
                 const TValue *p2, TValue *p3, int hasres) {
    ptrdiff_t result = savestack(L, p3);
    StkId func = L->top;
    setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
    setobj2s(L, func + 1, p1);  /* 1st argument */
    setobj2s(L, func + 2, p2);  /* 2nd argument */
    L->top += 3;
    if (!hasres)  /* no result? 'p3' is third argument */
            setobj2s (L, L->top++, p3);  /* 3rd argument */
    /* metamethod may yield only when called from Lua code */
    if (isLua(L->ci))
        luaD_call(L, func, hasres);
    else
        luaD_callnoyield(L, func, hasres);
    if (hasres) {  /* if has result, move it to its place */
        p3 = restorestack(L, result);
        setobjs2s(L, p3, --L->top);
    }
}